

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void dynet::TensorTools::logsumexp_dev<dynet::Device_CPU>
               (Device_CPU *dev,Tensor *x,Tensor *m,Tensor *z)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  char *__function;
  uint uVar4;
  DefaultDevice *pDVar5;
  float *pfVar6;
  uint uVar7;
  array<long,_1> aVar8;
  DefaultDevice *pDVar9;
  CoeffReturnType CVar10;
  CoeffReturnType CVar11;
  real rVar12;
  CoeffReturnType CVar13;
  CoeffReturnType CVar14;
  MaxReducer<float,_0> reducer;
  type local_1e0;
  XprType local_198;
  type local_188;
  undefined1 local_150 [24];
  undefined1 local_138 [8];
  array<Index,_NumPreservedStrides> local_130;
  undefined1 local_128 [16];
  array<Index,_NumReducedDims> local_118;
  array<Index,_NumReducedDims> local_110;
  DefaultDevice *local_108;
  Dimensions local_100;
  _Type local_f8;
  bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_> local_f0;
  DefaultDevice *local_e8;
  Dimensions local_e0;
  DefaultDevice *local_d8;
  EvaluatorPointerType local_c8;
  TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
  local_c0;
  
  lVar1 = (long)(int)(x->d).bd;
  uVar2 = (x->d).nd;
  if ((lVar1 == 1) && ((uVar2 < 2 || ((x->d).d[1] == 1)))) {
    local_108 = (DefaultDevice *)x->v;
    uVar4 = 1;
    if (uVar2 != 0) {
      uVar4 = (x->d).d[0];
    }
    local_130._M_elems[0] = (_Type)(long)(int)uVar4;
    local_150._0_8_ = m->v;
    local_150._16_8_ = dev->edevice;
    local_e8 = (DefaultDevice *)0x0;
    local_138[0] = 1;
    local_118._M_elems[0] = (_Type)1;
    local_128._8_8_ = local_130._M_elems[0];
    local_110._M_elems[0] = local_130._M_elems[0];
    local_100.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)local_130._M_elems[0];
    local_f8[0] = local_150._16_8_;
    local_e0.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)local_150._16_8_;
    CVar11 = Eigen::internal::
             InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::MaxReducer<float,_0>,_true,_true>
             ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                       *)local_138,0,(Index)local_130._M_elems[0],(MaxReducer<float,_0> *)&local_1e0
                     );
    if ((float *)local_150._0_8_ != (float *)0x0) {
      *(CoeffReturnType *)local_150._0_8_ = CVar11;
      if (local_e8 != (DefaultDevice *)0x0) {
        free(local_e8);
      }
      rVar12 = as_scalar(m);
      local_e8 = (DefaultDevice *)x->v;
      uVar2 = 1;
      if ((x->d).nd != 0) {
        uVar2 = (x->d).d[0];
      }
      local_130._M_elems[0] = (_Type)(long)(int)uVar2;
      local_150._0_8_ = z->v;
      local_150._16_8_ = dev->edevice;
      local_c8 = (EvaluatorPointerType)0x0;
      local_138[0] = 1;
      local_118._M_elems[0] = (_Type)1;
      local_128._8_8_ = local_130._M_elems[0];
      local_110._M_elems[0] = local_130._M_elems[0];
      local_108 = (DefaultDevice *)local_150._16_8_;
      local_f8[0] = local_150._16_8_;
      local_f0.m_value = rVar12;
      local_e0.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(array<long,_1>)local_130._M_elems[0];
      local_d8 = (DefaultDevice *)local_150._16_8_;
      local_c0.m_device = (DefaultDevice *)local_150._16_8_;
      CVar13 = Eigen::internal::
               InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_true,_true>
               ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                         *)local_138,0,(Index)local_130._M_elems[0],(SumReducer<float> *)&local_1e0)
      ;
      if ((float *)local_150._0_8_ != (float *)0x0) {
        *(CoeffReturnType *)local_150._0_8_ = CVar13;
        if (local_c8 != (EvaluatorPointerType)0x0) {
          free(local_c8);
        }
        local_150._0_8_ = z->v;
        local_150._16_8_ = dev->edevice;
        local_130._M_elems[0]._0_4_ = rVar12;
        local_138 = (undefined1  [8])local_150._16_8_;
        local_128._0_8_ = local_150._16_8_;
        local_118._M_elems[0] = (_Type)(_Type)local_150._0_8_;
        local_108 = (DefaultDevice *)local_150._16_8_;
        CVar14 = Eigen::
                 TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
                 ::coeff((TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
                          *)local_128,0);
        if ((float *)local_150._0_8_ != (float *)0x0) {
          *(float *)local_150._0_8_ = CVar14 + (real)local_130._M_elems[0];
          return;
        }
      }
    }
    __function = 
    "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
    ;
LAB_0041a830:
    __assert_fail("m_data != __null",
                  "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100,
                  __function);
  }
  if (uVar2 == 2) {
    uVar4 = (x->d).d[0];
    local_150._16_8_ = SEXT48((int)(x->d).d[1]);
  }
  else {
    uVar4 = 1;
    if (uVar2 != 0) {
      uVar4 = (x->d).d[0];
    }
    local_150._16_8_ = 1;
  }
  local_150._8_8_ = SEXT48((int)uVar4);
  local_150._0_8_ = x->v;
  local_130._M_elems[0] = (_Type)((ulong)local_130._M_elems[0] & 0xffffffff00000000);
  local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_data = m->v;
  uVar2 = 1;
  if ((m->d).nd != 0) {
    uVar2 = (m->d).d[0];
  }
  local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar2
  ;
  local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
       (long)(int)(m->d).bd;
  local_188.m_xpr.m_xpr.m_data = (StoragePointerType)&local_1e0;
  local_188.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)local_150;
  local_138 = (undefined1  [8])lVar1;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>
         *)&local_188,dev->edevice);
  uVar2 = (x->d).bd;
  if (uVar2 != 0) {
    pfVar6 = m->v;
    uVar4 = (x->d).d[1];
    uVar3 = (x->d).nd;
    aVar8._M_elems[0] = (_Type)0;
    uVar7 = uVar4;
    do {
      if (uVar3 < 2 || uVar7 != 0) {
        lVar1 = 0;
        pDVar9 = (DefaultDevice *)0x0;
        do {
          if (uVar3 == 2) {
            uVar2 = (x->d).d[0];
            local_150._16_8_ = SEXT48((int)uVar4);
          }
          else {
            uVar2 = 1;
            if (uVar3 != 0) {
              uVar2 = (x->d).d[0];
            }
            local_150._16_8_ = (DefaultDevice *)0x1;
          }
          local_138 = (undefined1  [8])(long)(int)(x->d).bd;
          local_150._8_8_ = SEXT48((int)uVar2);
          local_150._0_8_ = x->v;
          local_110._M_elems[0]._0_4_ = pfVar6[(long)pDVar9];
          uVar4 = 1;
          uVar2 = 1;
          if ((z->d).nd != 0) {
            uVar2 = (z->d).d[0];
          }
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_data = z->v;
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
               (long)(int)uVar2;
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
               (long)(int)(z->d).bd;
          local_188.m_xpr.m_xpr.m_data = (StoragePointerType)&local_1e0;
          local_188.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)local_150;
          local_1e0.m_xpr.m_xpr.m_xpr.m_offset = (Index)aVar8._M_elems[0];
          local_1e0.m_xpr.m_xpr.m_offset = (Index)pDVar9;
          local_130._M_elems[0] = aVar8._M_elems[0];
          local_128._8_8_ = pDVar9;
          Eigen::internal::
          TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
          ::run((TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::MakePointer>_>
                 *)&local_188,dev->edevice);
          if ((z->d).nd != 0) {
            uVar4 = (z->d).d[0];
          }
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_data = z->v;
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
               (long)(int)uVar4;
          local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
               (long)(int)(z->d).bd;
          local_1e0.m_functor.m_value = pfVar6[(long)pDVar9];
          local_198.m_lhs_xpr = &local_188;
          local_198.m_rhs_xpr = &local_1e0;
          local_1e0.m_xpr.m_xpr.m_xpr.m_offset = (Index)aVar8._M_elems[0];
          local_1e0.m_xpr.m_xpr.m_offset = (Index)pDVar9;
          local_188.m_xpr.m_xpr.m_data = local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_data;
          local_188.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
               local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
          local_188.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
               local_1e0.m_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
          local_188.m_xpr.m_offset = (Index)aVar8._M_elems[0];
          local_188.m_offset = (Index)pDVar9;
          Eigen::
          TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::DefaultDevice>
          ::TensorEvaluator((TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::DefaultDevice>
                             *)local_150,&local_198,dev->edevice);
          CVar10 = Eigen::
                   TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                   ::coeff(&local_c0,0);
          if (local_150._8_8_ != 1) {
            __assert_fail("m_stride == 1",
                          "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorChipping.h",
                          0x172,
                          "Index Eigen::TensorEvaluator<const Eigen::TensorChippingOp<0, Eigen::TensorChippingOp<1, Eigen::TensorMap<Eigen::Tensor<float, 2>>>>, Eigen::DefaultDevice>::srcCoeff(Index) const [Derived = const Eigen::TensorChippingOp<0, Eigen::TensorChippingOp<1, Eigen::TensorMap<Eigen::Tensor<float, 2>>>>, Device = Eigen::DefaultDevice]"
                         );
          }
          if ((long)local_128._0_8_ <= (long)local_150._16_8_) {
            __assert_fail("m_stride > index",
                          "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorChipping.h",
                          0x177,
                          "Index Eigen::TensorEvaluator<const Eigen::TensorChippingOp<1, Eigen::TensorMap<Eigen::Tensor<float, 2>>>, Eigen::DefaultDevice>::srcCoeff(Index) const [Derived = const Eigen::TensorChippingOp<1, Eigen::TensorMap<Eigen::Tensor<float, 2>>>, Device = Eigen::DefaultDevice]"
                         );
          }
          if (local_110._M_elems[0] == 0) {
            __function = 
            "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 2>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 2>>, Device = Eigen::DefaultDevice]"
            ;
            goto LAB_0041a830;
          }
          *(float *)((DefaultDevice *)((long)local_110._M_elems[0] + local_128._8_8_ * 4) +
                    local_150._16_8_ * 4) = CVar10 + local_c8._0_4_;
          pDVar9 = pDVar9 + 1;
          uVar4 = (x->d).d[1];
          uVar3 = (x->d).nd;
          pDVar5 = (DefaultDevice *)0x1;
          if (1 < uVar3) {
            pDVar5 = (DefaultDevice *)(ulong)uVar4;
          }
          lVar1 = lVar1 + 4;
        } while (pDVar9 < pDVar5);
        uVar2 = (x->d).bd;
        pfVar6 = (float *)((long)pfVar6 + lVar1);
        uVar7 = uVar4;
      }
      else {
        uVar7 = 0;
      }
      aVar8._M_elems[0] = (_Type)((long)aVar8._M_elems[0] + 1);
    } while ((ulong)aVar8._M_elems[0] < (DefaultDevice *)(ulong)uVar2);
  }
  return;
}

Assistant:

void TensorTools::logsumexp_dev(const MyDevice & dev, const Tensor& x, Tensor & m, Tensor& z) {
  if(x.d.bd == 1 && x.d[1] == 1) {
    m.t<0>().device(*dev.edevice) = x.t<1>().maximum();
#ifdef __CUDACC__
    Eigen::array<int, 1> bcast;
    bcast[0] = x.d[0];
    // This needs to be split into two lines to prevent memory allocation
    // TODO? Here and in logsoftmax: Is there a better way to subtract a scalar that is already on the GPU without using broadcasting (and without copying the scalar back to the host first)
    z.t<0>().device(*dev.edevice) = (x.t<1>() - m.t<1>().broadcast(bcast)).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + m.t<0>();
#else
    float mval = as_scalar(m);
    // This needs to be split into two lines to prevent memory allocation
    z.t<0>().device(*dev.edevice) = (x.t<1>() - mval).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + mval;
#endif
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    m.tb<1>().device(*dev.edevice) = x.tb<2>().maximum(red_axis);
    // TODO: Currently, the first version is slower on CPU, hence the switch
#ifdef __CUDACC__
    Eigen::array<int, 3> bcast({(int)x.d.rows(), 1, 1});
    Eigen::array<int, 3> morph({1, (int)m.d[0], (int)m.d.bd});
    // This needs to be split into two lines to prevent memory allocation
    z.tb<1>().device(*dev.edevice) = (x.tb<2>() - m.tb<2>().reshape(morph).broadcast(bcast)).exp().sum(red_axis);
    z.tb<1>().device(*dev.edevice) = z.tb<1>().log() + m.tb<1>();
#else
    auto miter = m.v;
    for(size_t b = 0; b < x.d.bd; ++b) {
      for(size_t i = 0; i < x.d[1]; ++i, ++miter) {
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = (x.tb<2>().chip<2>(b).chip<1>(i) - *miter).exp().sum();
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = z.tb<1>().chip<1>(b).chip<0>(i).log() + *miter;
      }
    }
#endif
  }
}